

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RenameExprUnmap(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  Walker local_40;
  
  uVar1 = pParse->eParseMode;
  local_40.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_40.walkerDepth = 0;
  local_40.eCode = 0;
  local_40.mWFlags = 0;
  local_40.u.pNC = (NameContext *)0x0;
  local_40.xExprCallback = renameUnmapExprCb;
  local_40.xSelectCallback = renameUnmapSelectCb;
  pParse->eParseMode = '\x03';
  if (pExpr != (Expr *)0x0) {
    local_40.pParse = pParse;
    sqlite3WalkExprNN(&local_40,pExpr);
  }
  pParse->eParseMode = uVar1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameExprUnmap(Parse *pParse, Expr *pExpr){
  u8 eMode = pParse->eParseMode;
  Walker sWalker;
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = pParse;
  sWalker.xExprCallback = renameUnmapExprCb;
  sWalker.xSelectCallback = renameUnmapSelectCb;
  pParse->eParseMode = PARSE_MODE_UNMAP;
  sqlite3WalkExpr(&sWalker, pExpr);
  pParse->eParseMode = eMode;
}